

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_cell_face(REF_GRID ref_grid)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS code;
  REF_BOOL report;
  REF_BOOL problem;
  REF_INT nodes [4];
  int local_50;
  REF_INT node;
  REF_INT cell_face;
  REF_INT cell;
  REF_INT group;
  REF_INT face;
  REF_INT *hits;
  REF_CELL ref_cell;
  REF_FACE ref_face;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_face = (REF_FACE)ref_grid->node;
  bVar2 = 0;
  ref_node = (REF_NODE)ref_grid;
  uVar3 = ref_face_create((REF_FACE *)&ref_cell,ref_grid);
  if (uVar3 == 0) {
    if ((int)ref_cell->type < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x122,"ref_validation_cell_face","malloc hits of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      _group = malloc((long)(int)ref_cell->type << 2);
      if (_group == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x122,"ref_validation_cell_face","malloc hits of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (cell = 0; cell < (int)ref_cell->type; cell = cell + 1) {
          *(undefined4 *)((long)_group + (long)cell * 4) = 0;
        }
        cell_face = 8;
        hits = &ref_node->ref_mpi->n;
        while (cell_face < 0x10) {
          for (node = 0; node < hits[0xb]; node = node + 1) {
            if (((-1 < node) && (node < hits[0xb])) &&
               (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
              for (local_50 = 0; local_50 < hits[5]; local_50 = local_50 + 1) {
                for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
                  (&report)[nodes[3]] =
                       *(REF_BOOL *)
                        (*(long *)(hits + 0xe) +
                        (long)(*(int *)(*(long *)(hits + 8) + (long)(nodes[3] + local_50 * 4) * 4) +
                              hits[2] * node) * 4);
                }
                uVar3 = ref_face_with((REF_FACE)ref_cell,&report,&cell);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                         ,300,"ref_validation_cell_face",(ulong)uVar3,"find cell face");
                  return uVar3;
                }
                *(int *)((long)_group + (long)cell * 4) =
                     *(int *)((long)_group + (long)cell * 4) + 1;
              }
            }
          }
          cell_face = cell_face + 1;
          hits = (REF_INT *)(&ref_node->global)[cell_face];
        }
        hits = ref_node->part;
        for (node = 0; node < hits[0xb]; node = node + 1) {
          if (((-1 < node) && (node < hits[0xb])) &&
             (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
            for (nodes[3] = 0; nodes[3] < 3; nodes[3] = nodes[3] + 1) {
              (&report)[nodes[3]] =
                   *(REF_BOOL *)(*(long *)(hits + 0xe) + (long)(nodes[3] + hits[2] * node) * 4);
            }
            nodes[1] = report;
            uVar3 = ref_face_with((REF_FACE)ref_cell,&report,&cell);
            if (uVar3 != 0) {
              ref_node_location(*(REF_NODE *)&ref_node->blank,report);
              ref_node_location(*(REF_NODE *)&ref_node->blank,problem);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[0]);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[1]);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x13f,"ref_validation_cell_face",(ulong)uVar3,"find tri");
              return uVar3;
            }
            *(int *)((long)_group + (long)cell * 4) = *(int *)((long)_group + (long)cell * 4) + 1;
          }
        }
        hits = *(REF_INT **)&ref_node->naux;
        for (node = 0; node < hits[0xb]; node = node + 1) {
          if (((-1 < node) && (node < hits[0xb])) &&
             (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
            for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
              (&report)[nodes[3]] =
                   *(REF_BOOL *)(*(long *)(hits + 0xe) + (long)(nodes[3] + hits[2] * node) * 4);
            }
            uVar3 = ref_face_with((REF_FACE)ref_cell,&report,&cell);
            if (uVar3 != 0) {
              ref_node_location(*(REF_NODE *)&ref_node->blank,report);
              ref_node_location(*(REF_NODE *)&ref_node->blank,problem);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[0]);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[1]);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x14f,"ref_validation_cell_face",(ulong)uVar3,"find qua");
              return uVar3;
            }
            *(int *)((long)_group + (long)cell * 4) = *(int *)((long)_group + (long)cell * 4) + 1;
          }
        }
        for (cell = 0; cell < (int)ref_cell->type; cell = cell + 1) {
          if (**(int **)ref_node < 2) {
            bVar4 = *(int *)((long)_group + (long)cell * 4) != 2;
          }
          else {
            bVar4 = 2 < *(int *)((long)_group + (long)cell * 4);
            if (((((ref_face[3].f2n[1] ==
                    (&(ref_face[1].adj)->nnode)
                    [*(int *)(*(long *)&ref_cell->size_per + (long)(cell << 2) * 4)]) ||
                  (ref_face[3].f2n[1] ==
                   (&(ref_face[1].adj)->nnode)
                   [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 1) * 4)])) ||
                 (ref_face[3].f2n[1] ==
                  (&(ref_face[1].adj)->nnode)
                  [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 2) * 4)])) ||
                (ref_face[3].f2n[1] ==
                 (&(ref_face[1].adj)->nnode)
                 [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 3) * 4)])) &&
               (bVar1 = !bVar4, bVar4 = true, bVar1)) {
              bVar4 = *(int *)((long)_group + (long)cell * 4) < 2;
            }
          }
          if (bVar4) {
            bVar2 = 1;
            printf(" hits %d\n",(ulong)*(uint *)((long)_group + (long)cell * 4));
            for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
              (&report)[nodes[3]] =
                   *(REF_BOOL *)(*(long *)&ref_cell->size_per + (long)(nodes[3] + cell * 4) * 4);
            }
            if (((report < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= report)) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)report * 8) < 0)) {
              local_b8 = 0xffffffffffffffff;
            }
            else {
              local_b8 = *(undefined8 *)
                          (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)report * 8);
            }
            if (((problem < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= problem)) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)problem * 8) < 0)) {
              local_c8 = 0xffffffffffffffff;
            }
            else {
              local_c8 = *(undefined8 *)
                          (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)problem * 8);
            }
            if (((nodes[0] < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= nodes[0])) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[0] * 8) < 0)) {
              local_d8 = 0xffffffffffffffff;
            }
            else {
              local_d8 = *(undefined8 *)
                          (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[0] * 8);
            }
            if (((nodes[1] < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= nodes[1])) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[1] * 8) < 0)) {
              local_e8 = 0xffffffffffffffff;
            }
            else {
              local_e8 = *(undefined8 *)
                          (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[1] * 8);
            }
            printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n",(ulong)(uint)cell,
                   (ulong)(uint)report,(ulong)(uint)problem,(ulong)(uint)nodes[0],
                   (ulong)(uint)nodes[1],local_b8,local_c8,local_d8,local_e8);
            uVar3 = ref_node_location(*(REF_NODE *)&ref_node->blank,report);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x16d,"ref_validation_cell_face",(ulong)uVar3,"n0",local_b8,local_c8,local_d8,
                     local_e8);
              return uVar3;
            }
            uVar3 = ref_node_location(*(REF_NODE *)&ref_node->blank,problem);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x16e,"ref_validation_cell_face",(ulong)uVar3,"n1",local_b8,local_c8,local_d8,
                     local_e8);
              return uVar3;
            }
            uVar3 = ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[0]);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x16f,"ref_validation_cell_face",(ulong)uVar3,"n2",local_b8,local_c8,local_d8,
                     local_e8);
              return uVar3;
            }
            uVar3 = ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[1]);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x170,"ref_validation_cell_face",(ulong)uVar3,"n3");
              return uVar3;
            }
          }
        }
        free(_group);
        ref_grid_local._4_4_ = ref_face_free((REF_FACE)ref_cell);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = (uint)bVar2;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x176,"ref_validation_cell_face",(ulong)ref_grid_local._4_4_,"face free");
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x120,"ref_validation_cell_face",(ulong)uVar3,"face");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem, report;
  REF_STATUS code;

  problem = REF_FALSE;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      problem = REF_TRUE;
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return (problem ? REF_FAILURE : REF_SUCCESS);
}